

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::beta_dist<long_double>::operator()(beta_dist<long_double> *this,lcg64_shift *r)

{
  result_type_conflict3 *prVar1;
  param_type *in_RSI;
  result_type_conflict3 *in_RDI;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  undefined8 in_stack_ffffffffffffffb2;
  undefined2 in_stack_ffffffffffffffc8;
  undefined6 uVar2;
  undefined2 in_stack_ffffffffffffffd6;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 in_stack_ffffffffffffffe2;
  undefined6 uVar5;
  
  utility::uniformoo<long_double,trng::lcg64_shift>((lcg64_shift *)0x37ae5b);
  uVar5 = (undefined6)in_ST0;
  param_type::alpha(in_RDI,in_RSI);
  uVar3 = (undefined2)in_ST1;
  uVar4 = (undefined2)((unkuint10)in_ST1 >> 0x40);
  param_type::beta(in_RDI,in_RSI);
  uVar2 = (undefined6)((unkuint10)in_ST2 >> 0x20);
  param_type::norm(in_RDI,in_RSI);
  prVar1 = (result_type_conflict3 *)
           math::inv_Beta_I((longdouble)CONCAT64(uVar5,CONCAT22(in_stack_ffffffffffffffe2,uVar4)),
                            (longdouble)CONCAT28(uVar3,CONCAT26(in_stack_ffffffffffffffd6,uVar2)),
                            (longdouble)CONCAT28(in_stack_ffffffffffffffc8,in_RDI),
                            (longdouble)
                            CONCAT82(in_stack_ffffffffffffffb2,(short)((unkuint10)in_ST3 >> 0x40)));
  return prVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return math::inv_Beta_I(utility::uniformoo<result_type>(r), P.alpha(), P.beta(),
                              P.norm());
    }